

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_merger.cpp
# Opt level: O2

void __thiscall duckdb::ARTMerger::MergeLeaves(ARTMerger *this,NodeEntry *entry)

{
  idx_t iVar1;
  ART *art;
  Node __tmp;
  Node *pNVar2;
  idx_t i;
  idx_t iVar3;
  array_ptr<unsigned_char,_true> aVar4;
  
  pNVar2 = entry->right;
  iVar3 = (entry->left->super_IndexPointer).data;
  iVar1 = (pNVar2->super_IndexPointer).data;
  if (((byte)(iVar3 >> 0x38) & 0x7f) < ((byte)(iVar1 >> 0x38) & 0x7f)) {
    (entry->left->super_IndexPointer).data = iVar1;
    (pNVar2->super_IndexPointer).data = iVar3;
    pNVar2 = entry->right;
  }
  aVar4 = GetBytes(this,pNVar2);
  for (iVar3 = 0; art = this->art, aVar4.count != iVar3; iVar3 = iVar3 + 1) {
    pNVar2 = entry->left;
    array_ptr<unsigned_char,_true>::AssertIndexInBounds(iVar3,aVar4.count);
    Node::InsertChild(art,pNVar2,aVar4.ptr[iVar3],(Node)0x0);
  }
  Node::Free(art,entry->right);
  return;
}

Assistant:

void ARTMerger::MergeLeaves(NodeEntry &entry) {
	D_ASSERT(entry.left.IsLeafNode());
	D_ASSERT(entry.right.IsLeafNode());
	D_ASSERT(entry.left.GetGateStatus() == GateStatus::GATE_NOT_SET);
	D_ASSERT(entry.right.GetGateStatus() == GateStatus::GATE_NOT_SET);

	// Merge the smaller leaf into the bigger leaf.
	if (entry.left.GetType() < entry.right.GetType()) {
		swap(entry.left, entry.right);
	}

	// Get the bytes of the right node.
	// Then, copy them into left.
	auto bytes = GetBytes(entry.right);

	// FIXME: Obtain a reference to left once and
	// FIXME: handle the different node type combinations.
	for (idx_t i = 0; i < bytes.size(); i++) {
		Node::InsertChild(art, entry.left, bytes[i]);
	}
	Node::Free(art, entry.right);
}